

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall
Rml::BaseXMLParser::FindString(BaseXMLParser *this,char *string,String *data,bool escape_brackets)

{
  char c;
  bool bVar1;
  char *pcVar2;
  undefined7 extraout_var;
  char previous;
  bool in_brackets;
  bool in_string;
  bool local_47;
  char local_46;
  bool local_45;
  undefined4 local_44;
  char *local_40;
  String *local_38;
  
  local_46 = *string;
  previous = '\0';
  local_47 = false;
  local_45 = false;
  local_44 = SUB84(&local_45,0);
  local_40 = string;
  local_38 = data;
  do {
    if ((this->xml_source)._M_string_length <= this->xml_index) {
      local_44 = 0;
      break;
    }
    c = Look(this);
    if (c == '\n') {
      this->line_number = this->line_number + 1;
    }
    if ((escape_brackets) &&
       (pcVar2 = XMLParseTools::ParseDataBrackets(&local_47,&local_45,c,previous),
       pcVar2 != (char *)0x0)) {
      local_44 = 0;
      Log::Message(LT_WARNING,"XML parse error. %s",pcVar2);
LAB_001e2f7a:
      bVar1 = false;
    }
    else {
      if ((c == local_46) &&
         ((local_47 == false && (bVar1 = PeekString(this,local_40,true), bVar1)))) {
        local_44 = (undefined4)CONCAT71(extraout_var,1);
        goto LAB_001e2f7a;
      }
      ::std::__cxx11::string::push_back((char)local_38);
      this->xml_index = this->xml_index + 1;
      bVar1 = true;
      previous = c;
    }
  } while (bVar1);
  return (bool)((byte)local_44 & 1);
}

Assistant:

bool BaseXMLParser::FindString(const char* string, String& data, bool escape_brackets)
{
	const char first_char = string[0];
	bool in_brackets = false;
	bool in_string = false;
	char previous = 0;

	while (!AtEnd())
	{
		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		if (escape_brackets)
		{
			const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
			if (error_str)
			{
				Log::Message(Log::LT_WARNING, "XML parse error. %s", error_str);
				return false;
			}
		}

		if (c == first_char && !in_brackets && PeekString(string))
		{
			return true;
		}

		data += c;
		previous = c;
		Next();
	}

	return false;
}